

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# putcols.c
# Opt level: O2

int ffpcns(fitsfile *fptr,int colnum,LONGLONG firstrow,LONGLONG firstelem,LONGLONG nelem,
          char **array,char *nulvalue,int *status)

{
  int iVar1;
  long lVar2;
  char **ppcVar3;
  ulong nelem_00;
  long lVar4;
  ulong nelempar;
  bool bVar5;
  long width;
  long local_58;
  char **local_50;
  long local_48;
  ulong local_40;
  long local_38;
  
  if (0 < *status) {
    return *status;
  }
  local_50 = array;
  if (fptr->HDUposition == fptr->Fptr->curhdu) {
    if ((fptr->Fptr->datastart == -1) && (iVar1 = ffrdef(fptr,status), 0 < iVar1))
    goto LAB_00198304;
  }
  else {
    ffmahd(fptr,fptr->HDUposition + 1,(int *)0x0,status);
  }
  ffgtcl(fptr,colnum,(int *)0x0,&local_58,&local_38,status);
  if (fptr->Fptr->hdutype == 2) {
    local_58 = local_58 / local_38;
  }
  lVar4 = (firstrow + -1) * local_58 + firstelem;
  nelem_00 = 0;
  if (nelem < 1) {
    nelem = nelem_00;
  }
  nelempar = 0;
  ppcVar3 = local_50;
  local_48 = lVar4;
  local_40 = nelem;
  while (bVar5 = nelem != 0, nelem = nelem - 1, bVar5) {
    iVar1 = strcmp(nulvalue,*ppcVar3);
    if (iVar1 == 0) {
      if ((nelem_00 != 0) &&
         (lVar2 = (long)(~nelem_00 + lVar4) / local_58,
         iVar1 = ffpcls(fptr,colnum,lVar2 + 1,lVar4 - (local_58 * lVar2 + nelem_00),nelem_00,
                        ppcVar3 + -nelem_00,status), 0 < iVar1)) goto LAB_00198304;
      nelempar = nelempar + 1;
      nelem_00 = 0;
    }
    else {
      if ((nelempar != 0) &&
         (lVar2 = (long)(~nelempar + lVar4) / local_58,
         iVar1 = ffpclu(fptr,colnum,lVar2 + 1,lVar4 - (local_58 * lVar2 + nelempar),nelempar,status)
         , 0 < iVar1)) goto LAB_00198304;
      nelem_00 = nelem_00 + 1;
      nelempar = 0;
    }
    ppcVar3 = ppcVar3 + 1;
    lVar4 = lVar4 + 1;
  }
  if (nelem_00 == 0) {
    if (nelempar != 0) {
      lVar4 = (long)((local_40 - nelempar) + local_48 + -1) / local_58;
      ffpclu(fptr,colnum,lVar4 + 1,((local_40 - nelempar) + local_48) - lVar4 * local_58,nelempar,
             status);
    }
  }
  else {
    lVar2 = local_40 - nelem_00;
    lVar4 = (local_48 + lVar2 + -1) / local_58;
    ffpcls(fptr,colnum,lVar4 + 1,(lVar2 + local_48) - lVar4 * local_58,nelem_00,local_50 + lVar2,
           status);
  }
LAB_00198304:
  return *status;
}

Assistant:

int ffpcns( fitsfile *fptr,  /* I - FITS file pointer                       */
            int  colnum,     /* I - number of column to write (1 = 1st col) */
            LONGLONG  firstrow,  /* I - first row to write (1 = 1st row)        */
            LONGLONG  firstelem, /* I - first vector element to write (1 = 1st) */
            LONGLONG  nelem,     /* I - number of values to write               */
            char  **array,   /* I - array of values to write                */
            char  *nulvalue, /* I - string representing a null value        */
            int  *status)    /* IO - error status                           */
/*
  Write an array of elements to the specified column of a table.  Any input
  pixels flagged as null will be replaced by the appropriate
  null value in the output FITS file. 
*/
{
    long repeat, width;
    LONGLONG ngood = 0, nbad = 0, ii;
    LONGLONG first, fstelm, fstrow;

    if (*status > 0)
        return(*status);

    /* reset position to the correct HDU if necessary */
    if (fptr->HDUposition != (fptr->Fptr)->curhdu)
    {
        ffmahd(fptr, (fptr->HDUposition) + 1, NULL, status);
    }
    else if ((fptr->Fptr)->datastart == DATA_UNDEFINED)
    {
        if ( ffrdef(fptr, status) > 0)               /* rescan header */
            return(*status);
    }

    /* get the vector repeat length of the column */
    ffgtcl(fptr, colnum, NULL, &repeat, &width, status);

    if ((fptr->Fptr)->hdutype == BINARY_TBL)
        repeat = repeat / width;    /* convert from chars to unit strings */

    /* absolute element number in the column */
    first = (firstrow - 1) * repeat + firstelem;

    for (ii = 0; ii < nelem; ii++)
    {
      if (strcmp(nulvalue, array[ii]))  /* is this a good pixel? */
      {
         if (nbad)  /* write previous string of bad pixels */
         {
            fstelm = ii - nbad + first;  /* absolute element number */
            fstrow = (fstelm - 1) / repeat + 1;  /* starting row number */
            fstelm = fstelm - (fstrow - 1) * repeat;  /* relative number */

            if (ffpclu(fptr, colnum, fstrow, fstelm, nbad, status) > 0)
                return(*status);
            nbad=0;
         }

         ngood = ngood +1;  /* the consecutive number of good pixels */
      }
      else
      {
         if (ngood)  /* write previous string of good pixels */
         {
            fstelm = ii - ngood + first;  /* absolute element number */
            fstrow = (fstelm - 1) / repeat + 1;  /* starting row number */
            fstelm = fstelm - (fstrow - 1) * repeat;  /* relative number */

            if (ffpcls(fptr, colnum, fstrow, fstelm, ngood, &array[ii-ngood],
                status) > 0)
                return(*status);

            ngood=0;
         }

         nbad = nbad +1;  /* the consecutive number of bad pixels */
      }
    }

    /* finished loop;  now just write the last set of pixels */

    if (ngood)  /* write last string of good pixels */
    {
      fstelm = ii - ngood + first;  /* absolute element number */
      fstrow = (fstelm - 1) / repeat + 1;  /* starting row number */
      fstelm = fstelm - (fstrow - 1) * repeat;  /* relative number */

      ffpcls(fptr, colnum, fstrow, fstelm, ngood, &array[ii-ngood], status);
    }
    else if (nbad) /* write last string of bad pixels */
    {
      fstelm = ii - nbad + first;  /* absolute element number */
      fstrow = (fstelm - 1) / repeat + 1;  /* starting row number */
      fstelm = fstelm - (fstrow - 1) * repeat;  /* relative number */

      ffpclu(fptr, colnum, fstrow, fstelm, nbad, status);
    }

    return(*status);
}